

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

void split_request(char *request)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  
  num_of_request_lines = 0;
  lVar3 = 0x125141;
  sVar1 = 1;
  while( true ) {
    sVar4 = sVar1;
    pcVar2 = strchr(request,10);
    if (pcVar2 == (char *)0x0) break;
    memcpy((void *)(lVar3 + -1),request,(size_t)(pcVar2 + (1 - (long)request)));
    pcVar2[lVar3 - (long)request] = '\0';
    request = pcVar2 + 1;
    lVar3 = lVar3 + 100;
    sVar1 = sVar4 + 1;
    num_of_request_lines = sVar4;
  }
  return;
}

Assistant:

static void split_request(const char *request)
{
	num_of_request_lines = 0;
	const char *from = request;
	const char *to = strchr(request, '\n');
	while (to != NULL) {
		ptrdiff_t bytes_to_copy = to - from + 1;
		memcpy(line_buffer[num_of_request_lines], from, (size_t)bytes_to_copy);
		line_buffer[num_of_request_lines][bytes_to_copy] = '\0';
		num_of_request_lines++;
		to++;
		from = to;
		to = strchr(to, '\n');
	}
}